

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

Expr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadSymbolicExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   *this)

{
  char code;
  TextReader<fmt::Locale> *this_00;
  char *pcVar1;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *pNVar2;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar3;
  int opcode;
  StringLiteral SVar4;
  ExprBase EVar5;
  ExprBase EVar6;
  ExprBase EVar7;
  ExprBase EVar8;
  NumericExpr NVar9;
  StringRef value;
  Impl *local_28;
  
  this_00 = this->reader_;
  pcVar1 = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = pcVar1;
  (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
  code = *pcVar1;
  if (code == 'o') {
    opcode = ReadOpCode(this);
    if (opcode == 0x41) {
      EVar5.impl_ = (Impl *)ReadLogicalExpr(this);
      EVar6.impl_ = (Impl *)ReadSymbolicExpr(this);
      EVar7.impl_ = (Impl *)ReadSymbolicExpr(this);
      pBVar3 = this->handler_->builder_;
      local_28 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar3->super_ExprFactory).exprs_,&local_28);
      EVar8.impl_ = (Impl *)operator_new__(0x100);
      (EVar8.impl_)->kind_ = IFSYM;
      ((ExprBase *)
      ((pBVar3->super_ExprFactory).exprs_.
       super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1))->impl_ = EVar8.impl_;
      ((ExprBase *)(EVar8.impl_ + 2))->impl_ = EVar5.impl_;
      ((ExprBase *)(EVar8.impl_ + 4))->impl_ = EVar6.impl_;
      ((ExprBase *)(EVar8.impl_ + 6))->impl_ = EVar7.impl_;
      return (Expr)EVar8.impl_;
    }
    NVar9 = ReadNumericExpr(this,opcode);
    return (Expr)NVar9.super_ExprBase.impl_;
  }
  if (code == 'h') {
    pNVar2 = this->handler_;
    value = TextReader<fmt::Locale>::ReadString(this_00);
    SVar4 = BasicExprFactory<std::allocator<char>_>::MakeStringLiteral
                      (&pNVar2->builder_->super_ExprFactory,value);
    return (Expr)SVar4.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase.impl_;
  }
  NVar9 = ReadNumericExpr(this,code,false);
  return (Expr)NVar9.super_ExprBase.impl_;
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}